

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_invocable.h
# Opt level: O0

void __thiscall
absl::lts_20250127::internal_any_invocable::CoreImpl<false,void,google::protobuf::io::Printer*>::
InitializeStorage<google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForExtension(int,google::protobuf::io::Printer*)::__0&,google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForExtension(int,google::protobuf::io::Printer*)::__0,void>
          (CoreImpl<false,void,google::protobuf::io::Printer*> *this,anon_class_16_3_514b5f86 *args)

{
  anon_class_16_3_514b5f86 *args_local;
  CoreImpl<false,_void,_google::protobuf::io::Printer_*> *this_local;
  
  *(FileGenerator **)this = args->this;
  *(undefined8 *)(this + 8) = *(undefined8 *)&args->idx;
  *(code **)(this + 0x18) =
       LocalInvoker<false,void,google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForExtension(int,google::protobuf::io::Printer*)::__0&,google::protobuf::io::Printer*>
  ;
  InitializeLocalManager<google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForExtension(int,google::protobuf::io::Printer*)::__0,void>
            (this);
  return;
}

Assistant:

void InitializeStorage(Args&&... args) {
    using RawT = RemoveCVRef<QualTRef>;
    ::new (static_cast<void*>(&state_.storage))
        RawT(std::forward<Args>(args)...);

    invoker_ = LocalInvoker<SigIsNoexcept, ReturnType, QualTRef, P...>;
    // We can simplify our manager if we know the type is trivially copyable.
    InitializeLocalManager<RawT>();
  }